

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int closeFileHandleList(FileHandle **list)

{
  PHYSFS_Io *pPVar1;
  __PHYSFS_FILEHANDLE__ *p_Var2;
  int iVar3;
  PHYSFS_Io *io;
  FileHandle *next;
  FileHandle *i;
  FileHandle **list_local;
  
  next = *list;
  while( true ) {
    if (next == (FileHandle *)0x0) {
      *list = (FileHandle *)0x0;
      return 1;
    }
    pPVar1 = next->io;
    p_Var2 = next->next;
    if ((pPVar1->flush != (_func_int_PHYSFS_Io_ptr *)0x0) &&
       (iVar3 = (*pPVar1->flush)(pPVar1), iVar3 == 0)) break;
    (*pPVar1->destroy)(pPVar1);
    (*__PHYSFS_AllocatorHooks.Free)(next);
    next = p_Var2;
  }
  *list = next;
  return 0;
}

Assistant:

static int closeFileHandleList(FileHandle **list)
{
    FileHandle *i;
    FileHandle *next = NULL;

    for (i = *list; i != NULL; i = next)
    {
        PHYSFS_Io *io = i->io;
        next = i->next;

        if (io->flush && !io->flush(io))
        {
            *list = i;
            return 0;
        } /* if */

        io->destroy(io);
        allocator.Free(i);
    } /* for */

    *list = NULL;
    return 1;
}